

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MixedBindingCase::createBuffers(MixedBindingCase *this)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int x;
  long lVar13;
  Vec4 *color;
  undefined1 **ppuVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> positionData;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorOffsetData;
  Vec4 yellow;
  Vec4 green;
  allocator_type local_81;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_80;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_68;
  undefined1 *local_50;
  undefined8 uStack_48;
  undefined1 *local_40;
  undefined8 uStack_38;
  long lVar8;
  
  iVar6 = (*((this->super_BindingRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  local_40 = (undefined1 *)0x3f80000000000000;
  uStack_38 = 0x3f80000000000000;
  local_50 = &DAT_3f8000003f800000;
  uStack_48 = 0x3f80000000000000;
  bVar18 = 1 < this->m_case - CASE_INSTANCED_BINDING;
  uVar15 = 400;
  if (!bVar18) {
    uVar15 = 1;
  }
  uVar17 = (uint)bVar18 * 5 + 1;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_80,(ulong)(uVar15 * 6),(allocator_type *)&local_68);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_68,(ulong)(uVar17 * 800),&local_81);
  uVar9 = (ulong)uVar15;
  lVar10 = 0;
  do {
    puVar1 = (undefined8 *)
             ((long)(local_80.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10);
    *puVar1 = 0;
    puVar1[1] = 0x3f80000000000000;
    puVar1 = (undefined8 *)
             ((long)local_80.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar10);
    *puVar1 = 0x3dcccccd00000000;
    puVar1[1] = 0x3f80000000000000;
    puVar1 = (undefined8 *)
             ((long)local_80.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar10);
    *puVar1 = 0x3dcccccd3dcccccd;
    puVar1[1] = 0x3f80000000000000;
    puVar1 = (undefined8 *)
             ((long)local_80.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar10);
    *puVar1 = 0;
    puVar1[1] = 0x3f80000000000000;
    puVar1 = (undefined8 *)
             ((long)local_80.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar10);
    *puVar1 = 0x3dcccccd3dcccccd;
    puVar1[1] = 0x3f80000000000000;
    puVar1 = (undefined8 *)
             ((long)local_80.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[5].m_data + lVar10);
    *puVar1 = 0x3dcccccd;
    puVar1[1] = 0x3f80000000000000;
    lVar10 = lVar10 + 0x60;
    uVar9 = uVar9 - 1;
  } while (uVar9 != 0);
  lVar10 = 0;
  lVar11 = 0;
  do {
    fVar19 = (float)(int)lVar11 / 20.0;
    lVar13 = 0;
    lVar12 = lVar10;
    do {
      ppuVar14 = &local_50;
      if (((int)lVar13 + (int)lVar11 & 1U) == 0) {
        ppuVar14 = &local_40;
      }
      fVar20 = (float)(int)lVar13 / 20.0;
      uVar9 = (ulong)uVar17;
      lVar16 = lVar12;
      do {
        uVar3 = *(undefined4 *)((long)ppuVar14 + 4);
        uVar4 = *(undefined4 *)(ppuVar14 + 1);
        uVar5 = *(undefined4 *)((long)ppuVar14 + 0xc);
        puVar2 = (undefined4 *)
                 ((long)(local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16);
        *puVar2 = *(undefined4 *)ppuVar14;
        puVar2[1] = uVar3;
        puVar2[2] = uVar4;
        puVar2[3] = uVar5;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar16) =
             fVar20 + fVar20 + -1.0;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar16 + 4) =
             fVar19 + fVar19 + -1.0;
        *(undefined8 *)
         ((long)local_68.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[1].m_data + lVar16 + 8) = 0;
        lVar16 = lVar16 + 0x20;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + (ulong)(uVar17 * 0x20);
    } while (lVar13 != 0x14);
    lVar11 = lVar11 + 1;
    lVar10 = lVar10 + (ulong)(uVar17 * 0x80) * 5;
  } while (lVar11 != 0x14);
  (**(code **)(lVar8 + 0x6c8))(1,&this->m_posBuffer);
  (**(code **)(lVar8 + 0x40))(0x8892,this->m_posBuffer);
  (**(code **)(lVar8 + 0x150))
            (0x8892,(long)((int)local_80.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (int)local_80.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0,
             local_80.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"upload position data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x413);
  (**(code **)(lVar8 + 0x6c8))(1,&this->m_colorOffsetBuffer);
  (**(code **)(lVar8 + 0x40))(0x8892,this->m_colorOffsetBuffer);
  (**(code **)(lVar8 + 0x150))
            (0x8892,(long)((int)local_68.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (int)local_68.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0,
             local_68.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"upload position data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x418);
  if (local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MixedBindingCase::createBuffers (void)
{
	const glw::Functions&	gl								= m_context.getRenderContext().getFunctions();
	const tcu::Vec4			green							= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4			yellow							= tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);

	// draw grid. In instanced mode, each cell is an instance
	const bool				instanced						= (m_case == CASE_INSTANCED_BINDING) || (m_case == CASE_INSTANCED_ATTRIB);
	const int				numCells						= GRID_SIZE*GRID_SIZE;
	const int				numPositionCells				= (instanced) ? (1) : (numCells);
	const int				numPositionElements				= 6 * numPositionCells;
	const int				numInstanceElementsPerCell		= (instanced) ? (1) : (6);
	const int				numColorOffsetElements			= numInstanceElementsPerCell * numCells;

	std::vector<tcu::Vec4>	positionData					(numPositionElements);
	std::vector<tcu::Vec4>	colorOffsetData					(2 * numColorOffsetElements);

	// positions

	for (int primNdx = 0; primNdx < numPositionCells; ++primNdx)
	{
		positionData[primNdx*6 + 0] =  tcu::Vec4(0.0f,				0.0f,				0.0f, 1.0f);
		positionData[primNdx*6 + 1] =  tcu::Vec4(0.0f,				2.0f / GRID_SIZE,	0.0f, 1.0f);
		positionData[primNdx*6 + 2] =  tcu::Vec4(2.0f / GRID_SIZE,	2.0f / GRID_SIZE,	0.0f, 1.0f);
		positionData[primNdx*6 + 3] =  tcu::Vec4(0.0f,				0.0f,				0.0f, 1.0f);
		positionData[primNdx*6 + 4] =  tcu::Vec4(2.0f / GRID_SIZE,	2.0f / GRID_SIZE,	0.0f, 1.0f);
		positionData[primNdx*6 + 5] =  tcu::Vec4(2.0f / GRID_SIZE,	0.0f,				0.0f, 1.0f);
	}

	// color & offset

	for (int y = 0; y < GRID_SIZE; ++y)
	for (int x = 0; x < GRID_SIZE; ++x)
	{
		for (int v = 0; v < numInstanceElementsPerCell; ++v)
		{
			const tcu::Vec4& color = ((x + y) % 2 == 0) ? (green) : (yellow);

			colorOffsetData[((y * GRID_SIZE + x) * numInstanceElementsPerCell + v) * 2 + 0] = color;
			colorOffsetData[((y * GRID_SIZE + x) * numInstanceElementsPerCell + v) * 2 + 1] = tcu::Vec4(float(x) / float(GRID_SIZE) * 2.0f - 1.0f, float(y) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 0.0f);
		}
	}

	// upload vertex data

	gl.genBuffers(1, &m_posBuffer);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_posBuffer);
	gl.bufferData(GL_ARRAY_BUFFER, (int)(positionData.size() * sizeof(tcu::Vec4)), positionData[0].getPtr(), GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "upload position data");

	gl.genBuffers(1, &m_colorOffsetBuffer);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_colorOffsetBuffer);
	gl.bufferData(GL_ARRAY_BUFFER, (int)(colorOffsetData.size() * sizeof(tcu::Vec4)), colorOffsetData[0].getPtr(), GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "upload position data");
}